

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGhsMultiGenerator::WriteTargets(cmGlobalGhsMultiGenerator *this,cmLocalGenerator *root)

{
  pointer pcVar1;
  pointer ppcVar2;
  cmGeneratorTarget *this_00;
  char *pcVar3;
  pointer ppcVar4;
  bool bVar5;
  TargetType TVar6;
  int iVar7;
  string *psVar8;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *__range3;
  cmGlobalGhsMultiGenerator *pcVar9;
  pointer ppcVar10;
  cmGeneratorTarget **tgt;
  pointer ppcVar11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> build;
  string rootBinaryDir;
  string name;
  string fname;
  cmGeneratedFileStream fbld;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> local_368;
  cmGlobalGhsMultiGenerator *local_350;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  basic_string_view<char,_std::char_traits<char>_> local_2c8;
  size_type local_2b8;
  pointer local_2b0;
  undefined8 local_2a8;
  char *local_2a0;
  _func_int **local_298;
  cmDuration local_290;
  _Alloc_hider local_288;
  char *local_280;
  undefined8 local_278;
  undefined8 local_270;
  
  psVar8 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(root);
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  pcVar1 = (psVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_348,pcVar1,pcVar1 + psVar8->_M_string_length);
  ppcVar10 = (this->ProjectTargets).
             super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppcVar2 = (this->ProjectTargets).
            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_350 = this;
  if (ppcVar10 != ppcVar2) {
    do {
      this_00 = *ppcVar10;
      TVar6 = cmGeneratorTarget::GetType(this_00);
      if (((TVar6 != INTERFACE_LIBRARY) &&
          (TVar6 = cmGeneratorTarget::GetType(this_00), TVar6 != MODULE_LIBRARY)) &&
         (TVar6 = cmGeneratorTarget::GetType(this_00), TVar6 != SHARED_LIBRARY)) {
        TVar6 = cmGeneratorTarget::GetType(this_00);
        if (TVar6 == GLOBAL_TARGET) {
          psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
          (*(local_350->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x1a])();
          iVar7 = std::__cxx11::string::compare((char *)psVar8);
          if (iVar7 != 0) goto LAB_004255af;
        }
        psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
        pcVar3 = FILE_EXTENSION;
        local_290.__r = (rep_conflict)(psVar8->_M_dataplus)._M_p;
        local_298 = (_func_int **)psVar8->_M_string_length;
        local_288._M_p = (pointer)0x4;
        local_280 = ".tgt";
        local_278 = strlen(FILE_EXTENSION);
        local_270 = pcVar3;
        views._M_len = 3;
        views._M_array = (iterator)&stack0xfffffffffffffd68;
        cmCatViews_abi_cxx11_(&local_328,views);
        local_298 = (_func_int **)local_348._M_string_length;
        local_290.__r = (rep_conflict)local_348._M_dataplus._M_p;
        local_288._M_p = &DAT_00000001;
        local_280 = "/";
        local_278 = local_328._M_string_length;
        local_270 = local_328._M_dataplus._M_p;
        views_00._M_len = 3;
        views_00._M_array = (iterator)&stack0xfffffffffffffd68;
        cmCatViews_abi_cxx11_(&local_2e8,views_00);
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)&stack0xfffffffffffffd68,&local_2e8,false,None);
        pcVar9 = (cmGlobalGhsMultiGenerator *)&stack0xfffffffffffffd68;
        cmGeneratedFileStream::SetCopyIfDifferent
                  ((cmGeneratedFileStream *)&stack0xfffffffffffffd68,true);
        WriteFileHeader(pcVar9,(ostream *)&stack0xfffffffffffffd68);
        GhsMultiGpj::WriteGpjTag(PROJECT,(ostream *)&stack0xfffffffffffffd68);
        local_368.
        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_368.
        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_368.
        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pcVar9 = local_350;
        bVar5 = ComputeTargetBuildOrder(local_350,this_00,&local_368);
        ppcVar4 = local_368.
                  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ppcVar11 = local_368.
                   super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if (bVar5) {
          psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
          local_2b0 = (psVar8->_M_dataplus)._M_p;
          local_2b8 = psVar8->_M_string_length;
          local_2c8._M_len = 0x2e;
          local_2c8._M_str = "The inter-target dependency graph for target [";
          local_2a8 = 0xf;
          local_2a0 = "] had a cycle.\n";
          views_01._M_len = 3;
          views_01._M_array = &local_2c8;
          cmCatViews_abi_cxx11_(&local_308,views_01);
          cmSystemTools::Error(&local_308);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._M_dataplus._M_p != &local_308.field_2) {
            operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          for (; ppcVar11 != ppcVar4; ppcVar11 = ppcVar11 + 1) {
            WriteProjectLine(pcVar9,(ostream *)&stack0xfffffffffffffd68,*ppcVar11,&local_348);
          }
        }
        cmGeneratedFileStream::Close((cmGeneratedFileStream *)&stack0xfffffffffffffd68);
        if (local_368.
            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_368.
                          super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_368.
                                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_368.
                                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        cmGeneratedFileStream::~cmGeneratedFileStream
                  ((cmGeneratedFileStream *)&stack0xfffffffffffffd68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
      }
LAB_004255af:
      ppcVar10 = ppcVar10 + 1;
    } while (ppcVar10 != ppcVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteTargets(cmLocalGenerator* root)
{
  std::string rootBinaryDir = root->GetCurrentBinaryDirectory();

  // All known targets
  for (cmGeneratorTarget const* target : this->ProjectTargets) {
    if (target->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
        target->GetType() == cmStateEnums::MODULE_LIBRARY ||
        target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        (target->GetType() == cmStateEnums::GLOBAL_TARGET &&
         target->GetName() != this->GetInstallTargetName())) {
      continue;
    }

    // create target build file
    std::string name = cmStrCat(target->GetName(), ".tgt", FILE_EXTENSION);
    std::string fname = cmStrCat(rootBinaryDir, "/", name);
    cmGeneratedFileStream fbld(fname);
    fbld.SetCopyIfDifferent(true);
    this->WriteFileHeader(fbld);
    GhsMultiGpj::WriteGpjTag(GhsMultiGpj::PROJECT, fbld);
    std::vector<cmGeneratorTarget const*> build;
    if (this->ComputeTargetBuildOrder(target, build)) {
      cmSystemTools::Error(
        cmStrCat("The inter-target dependency graph for target [",
                 target->GetName(), "] had a cycle.\n"));
    } else {
      for (auto& tgt : build) {
        this->WriteProjectLine(fbld, tgt, rootBinaryDir);
      }
    }
    fbld.Close();
  }
}